

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-ni.c
# Opt level: O2

void aes_cbc_ni_decrypt(ssh_cipher *ciph,void *vblk,int blklen,aes_ni_fn decrypt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ssh_cipheralg *psVar4;
  ssh_cipheralg *psVar5;
  undefined4 in_register_00000014;
  __m128i *palVar6;
  uint *puVar7;
  uint8_t *blk;
  uint *puVar8;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  __m128i alVar9;
  
  palVar6 = (__m128i *)CONCAT44(in_register_00000014,blklen);
  puVar7 = (uint *)((long)blklen + (long)vblk);
  for (puVar8 = (uint *)vblk; puVar8 < puVar7; puVar8 = puVar8 + 4) {
    psVar4 = *(ssh_cipheralg **)puVar8;
    psVar5 = *(ssh_cipheralg **)(puVar8 + 2);
    alVar9[1] = (longlong)vblk;
    alVar9[0] = (longlong)(ciph + -0x21);
    alVar9 = (*decrypt)(alVar9,palVar6);
    palVar6 = alVar9[1];
    uVar1 = *(uint *)((long)&ciph[-3].vt + 4);
    uVar2 = *(uint *)&ciph[-2].vt;
    uVar3 = *(uint *)((long)&ciph[-2].vt + 4);
    *puVar8 = extraout_XMM0_Da ^ *(uint *)&ciph[-3].vt;
    puVar8[1] = extraout_XMM0_Db ^ uVar1;
    puVar8[2] = extraout_XMM0_Dc ^ uVar2;
    puVar8[3] = extraout_XMM0_Dd ^ uVar3;
    ciph[-3].vt = psVar4;
    ciph[-2].vt = psVar5;
  }
  return;
}

Assistant:

static inline void aes_cbc_ni_decrypt(
    ssh_cipher *ciph, void *vblk, int blklen, aes_ni_fn decrypt)
{
    aes_ni_context *ctx = container_of(ciph, aes_ni_context, ciph);

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {
        __m128i ciphertext = _mm_loadu_si128((const __m128i *)blk);
        __m128i decrypted = decrypt(ciphertext, ctx->keysched_d);
        __m128i plaintext = _mm_xor_si128(decrypted, ctx->iv);
        _mm_storeu_si128((__m128i *)blk, plaintext);
        ctx->iv = ciphertext;
    }
}